

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::Visit
          (CodeGenerateVisitor *this,AssignmentStatement *assign_stmt,void *data)

{
  int iVar1;
  GenerateFunction *pGVar2;
  SyntaxTree *pSVar3;
  String *pSVar4;
  int iVar5;
  CodeGenerateException *this_00;
  anon_union_16_2_eed97686_for_String_2 *module;
  int iVar6;
  VarListData_conflict var_list_data;
  Guard g;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  Guard local_48;
  
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1159:9)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1159:9)>
             ::_M_manager;
  local_68._12_4_ = 0;
  local_68._8_4_ = this->current_function_->register_id_;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1159:9)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1159:9)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  Guard::Guard(&local_48,(function<void_()> *)&local_88,(function<void_()> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  pGVar2 = this->current_function_;
  iVar1 = pGVar2->register_id_;
  iVar6 = (int)assign_stmt->var_count_ + iVar1;
  pGVar2->register_id_ = iVar6;
  iVar5 = pGVar2->register_max_;
  if (pGVar2->register_max_ < iVar6) {
    pGVar2->register_max_ = iVar6;
    iVar5 = iVar6;
  }
  if (iVar5 < 0xfb) {
    local_88._4_4_ = iVar6;
    local_88._0_4_ = iVar1;
    pSVar3 = (assign_stmt->exp_list_)._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this);
    pSVar3 = (assign_stmt->var_list_)._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this);
    Guard::~Guard(&local_48);
    return;
  }
  this_00 = (CodeGenerateException *)__cxa_allocate_exception(0x20);
  pSVar4 = this->current_function_->function_->module_;
  if ((pSVar4->super_GCObject).field_0x11 == '\0') {
    module = &pSVar4->field_1;
  }
  else {
    module = (anon_union_16_2_eed97686_for_String_2 *)(pSVar4->field_1).str_;
  }
  CodeGenerateException::CodeGenerateException<char_const(&)[36]>
            (this_00,module->str_buffer_,assign_stmt->line_,
             (char (*) [36])"assignment statement is too complex");
  __cxa_throw(this_00,&CodeGenerateException::typeinfo,Exception::~Exception);
}

Assistant:

void CodeGenerateVisitor::Visit(AssignmentStatement *assign_stmt, void *data)
    {
        REGISTER_GENERATOR_GUARD();

        // Reserve registers for var list
        int register_id = GetNextRegisterId();
        int end_register = register_id + assign_stmt->var_count_;
        ResetRegisterIdGenerator(end_register);
        if (IsRegisterCountOverflow())
        {
            throw CodeGenerateException(
                GetCurrentFunction()->GetModule()->GetCStr(),
                assign_stmt->line_,
                "assignment statement is too complex");
        }

        try
        {
            // Get exp list results placed into [register_id, end_register)
            ExpListData exp_list_data{ register_id, end_register };
            assign_stmt->exp_list_->Accept(this, &exp_list_data);
        }
        catch (const CodeGenerateException &)
        {
            // Exp list consume some registers, and register count overflow,
            // catch it, throw new exception to report assignment statement
            // is too complex
            throw CodeGenerateException(
                GetCurrentFunction()->GetModule()->GetCStr(),
                assign_stmt->line_,
                "assignment statement is too complex");
        }

        // Assign results to var list
        VarListData var_list_data{ register_id, end_register };
        assign_stmt->var_list_->Accept(this, &var_list_data);
    }